

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::Texture3DLodControlCase::Texture3DLodControlCase
          (Texture3DLodControlCase *this,Context *context,char *name,char *desc,deUint32 minFilter)

{
  RenderContext *context_00;
  TestContext *this_00;
  TestLog *log;
  deUint32 minFilter_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  Texture3DLodControlCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture3DLodControlCase_0329be18;
  this->m_texWidth = 0x20;
  this->m_texHeight = 0x20;
  this->m_texDepth = 0x20;
  this->m_minFilter = minFilter;
  this->m_texture = (Texture3D *)0x0;
  context_00 = gles3::Context::getRenderContext(context);
  this_00 = gles3::Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context_00,log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  return;
}

Assistant:

Texture3DLodControlCase::Texture3DLodControlCase (Context& context, const char* name, const char* desc, deUint32 minFilter)
	: TestCase			(context, name, desc)
	, m_texWidth		(32)
	, m_texHeight		(32)
	, m_texDepth		(32)
	, m_minFilter		(minFilter)
	, m_texture			(DE_NULL)
	, m_renderer		(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
{
}